

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcRailingType::~IfcRailingType(IfcRailingType *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&this[-1].field_0x48 = 0x8749b0;
  *(undefined8 *)&this->field_0x30 = 0x874ac8;
  *(undefined8 *)&this[-1].field_0xd0 = 0x8749d8;
  *(undefined8 *)&this[-1].field_0xe0 = 0x874a00;
  *(undefined8 *)&this[-1].field_0x138 = 0x874a28;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRailingType,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x874a50;
  *(undefined8 *)&this[-1].field_0x1c8 = 0x874a78;
  *(undefined8 *)this = 0x874aa0;
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10);
  }
  *(undefined8 *)&this[-1].field_0x48 = 0x874d90;
  *(undefined8 *)&this->field_0x30 = 0x874e58;
  *(undefined8 *)&this[-1].field_0xd0 = 0x874db8;
  *(undefined8 *)&this[-1].field_0xe0 = 0x874de0;
  *(undefined8 *)&this[-1].field_0x138 = 0x874e08;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRailingType,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x874e30;
  puVar1 = *(undefined1 **)
            &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRailingType,_1UL>.field_0x10;
  if (puVar1 != &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRailingType,_1UL>.
                 field_0x20) {
    operator_delete(puVar1);
  }
  IfcTypeProduct::~IfcTypeProduct
            ((IfcTypeProduct *)&this[-1].field_0x48,&PTR_construction_vtable_24__00874af0);
  operator_delete(&this[-1].field_0x48);
  return;
}

Assistant:

IfcRailingType() : Object("IfcRailingType") {}